

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackTGZGenerator.cxx
# Opt level: O2

void __thiscall cmCPackTGZGenerator::cmCPackTGZGenerator(cmCPackTGZGenerator *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"paxr",&local_31);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressGZip,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackTGZGenerator_005d3948;
  return;
}

Assistant:

cmCPackTGZGenerator::cmCPackTGZGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressGZip,
                           "paxr")
{
}